

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O0

void __thiscall
BamTools::SplitTool::SplitToolPrivate::DetermineOutputFilenameStub(SplitToolPrivate *this)

{
  long *in_RDI;
  string *in_stack_ffffffffffffffb8;
  string local_28 [40];
  
  if ((*(byte *)(*in_RDI + 1) & 1) == 0) {
    if ((*(byte *)*in_RDI & 1) == 0) {
      GetTimestampString_abi_cxx11_();
      std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)&stack0xffffffffffffffb8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    }
    else {
      RemoveFilenameExtension(in_stack_ffffffffffffffb8);
      std::__cxx11::string::operator=((string *)(in_RDI + 1),local_28);
      std::__cxx11::string::~string(local_28);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)(*in_RDI + 0x10));
  }
  return;
}

Assistant:

void SplitTool::SplitToolPrivate::DetermineOutputFilenameStub()
{

    // if user supplied output filename stub, use that
    if (m_settings->HasCustomOutputStub) m_outputFilenameStub = m_settings->CustomOutputStub;

    // else if user supplied input BAM filename, use that (minus ".bam" extension) as stub
    else if (m_settings->HasInputFilename)
        m_outputFilenameStub = RemoveFilenameExtension(m_settings->InputFilename);

    // otherwise, user did not specify -stub, and input is coming from STDIN
    // generate stub from timestamp
    else
        m_outputFilenameStub = GetTimestampString();
}